

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

Node * __thiscall parser::Parser::parse(Node *__return_storage_ptr__,Parser *this,Tokens *tokens)

{
  ostream *poVar1;
  ParserError *pPVar2;
  pointer nextToken;
  const_iterator __first;
  Nodes nodeStack;
  StateStack stateStack;
  ActionState actionState;
  Nodes nodes;
  Production local_b0;
  Node local_90;
  
  stateStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  stateStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  stateStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::push_back(&stateStack,&StartNonTerminal);
  nodeStack.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nodeStack.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nodeStack.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nextToken = (tokens->super__Vector_base<lexer::Token,_std::allocator<lexer::Token>_>)._M_impl.
              super__Vector_impl_data._M_start;
  do {
    action(&actionState,this,
           stateStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish[-1],nextToken->tokenId);
    switch(actionState.action) {
    case Shift:
      Node::Node(&local_90,nextToken);
      std::vector<parser::Node,_std::allocator<parser::Node>_>::emplace_back<parser::Node>
                (&nodeStack,&local_90);
      Node::~Node(&local_90);
      std::vector<int,_std::allocator<int>_>::push_back(&stateStack,&actionState.state);
      if (this->debug == true) {
        poVar1 = stringifyStep(this,(ostream *)&std::cout,&stateStack,&nodeStack,&actionState,
                               nextToken);
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      nextToken = nextToken + 1;
      if (nextToken ==
          (tokens->super__Vector_base<lexer::Token,_std::allocator<lexer::Token>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        pPVar2 = (ParserError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"error state",(allocator<char> *)&local_b0);
        ParserError::ParserError(pPVar2,(string *)&local_90);
        __cxa_throw(pPVar2,&ParserError::typeinfo,std::runtime_error::~runtime_error);
      }
      break;
    case Reduce:
      nodes.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nodes.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      nodes.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __first._M_current =
           nodeStack.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
           super__Vector_impl_data._M_finish + -actionState.reduceCount;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<parser::Node*,std::back_insert_iterator<std::vector<parser::Node,std::allocator<parser::Node>>>>
                (__first._M_current,
                 nodeStack.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish,&nodes);
      std::vector<parser::Node,_std::allocator<parser::Node>_>::erase
                (&nodeStack,__first,
                 (const_iterator)
                 nodeStack.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      local_b0.nonTerminal = actionState.nonTerminal;
      std::vector<parser::Node,_std::allocator<parser::Node>_>::vector(&local_b0.nodes,&nodes);
      Node::Node(&local_90,&local_b0);
      std::vector<parser::Node,_std::allocator<parser::Node>_>::emplace_back<parser::Node>
                (&nodeStack,&local_90);
      Node::~Node(&local_90);
      std::vector<parser::Node,_std::allocator<parser::Node>_>::~vector(&local_b0.nodes);
      std::vector<int,_std::allocator<int>_>::erase
                (&stateStack,
                 (const_iterator)
                 (stateStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -actionState.reduceCount),
                 (const_iterator)
                 stateStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      local_90._0_4_ =
           goTo(this,stateStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1],actionState.nonTerminal);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&stateStack,(int *)&local_90);
      if (this->debug == true) {
        poVar1 = stringifyStep(this,(ostream *)&std::cout,&stateStack,&nodeStack,&actionState,
                               nextToken);
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      std::vector<parser::Node,_std::allocator<parser::Node>_>::~vector(&nodes);
      break;
    case Accept:
      if ((long)nodeStack.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)nodeStack.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                super__Vector_impl_data._M_start != 0x60) {
        pPVar2 = (ParserError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"work done but, stack contains more than one element",
                   (allocator<char> *)&local_b0);
        ParserError::ParserError(pPVar2,(string *)&local_90);
        __cxa_throw(pPVar2,&ParserError::typeinfo,std::runtime_error::~runtime_error);
      }
      Node::Node(__return_storage_ptr__,
                 nodeStack.super__Vector_base<parser::Node,_std::allocator<parser::Node>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
      std::vector<parser::Node,_std::allocator<parser::Node>_>::~vector(&nodeStack);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&stateStack.super__Vector_base<int,_std::allocator<int>_>);
      return __return_storage_ptr__;
    case Error:
      pPVar2 = (ParserError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"error state",(allocator<char> *)&local_b0);
      ParserError::ParserError(pPVar2,(string *)&local_90);
      __cxa_throw(pPVar2,&ParserError::typeinfo,std::runtime_error::~runtime_error);
    }
  } while( true );
}

Assistant:

Node parse(lexer::Tokens const& tokens) {
            StateStack stateStack;
            stateStack.push_back(StartNonTerminal);
            Nodes nodeStack;
            Tokens::const_iterator token = tokens.begin();
            while (true) {
                ActionState actionState = action(stateStack.back(), token->tokenId);
                if (actionState.action == Shift) {
                    nodeStack.push_back(Node(*token));
                    stateStack.push_back(actionState.state);
                    if (debug)
                        stringifyStep(std::cout, stateStack, nodeStack, actionState, *token) << std::endl;
                    ++token;
					if (token == tokens.end()) {
						throw ParserError("error state");
					}
                } else if (actionState.action == Reduce) {
                    Nodes nodes;
                    Nodes::iterator start = nodeStack.end() - actionState.reduceCount;
                    std::copy(start,
                              nodeStack.end(),
                              std::back_inserter(nodes));

                    nodeStack.erase(start, nodeStack.end());
                    nodeStack.push_back(Node(Production(actionState.nonTerminal, nodes)));

                    stateStack.erase(stateStack.end() - actionState.reduceCount, stateStack.end());
                    stateStack.push_back(goTo(stateStack.back(), actionState.nonTerminal));

                    if (debug)
                        stringifyStep(std::cout, stateStack, nodeStack, actionState, *token) << std::endl;
                } else if (actionState.action == Error) {
                    throw ParserError("error state");
                } else if (actionState.action == Accept) {
                    return nodeStack.size() == 1
                           ? nodeStack.back()
                           : throw ParserError("work done but, stack contains more than one element");
                }
            }
        }